

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolMACEthernet.cpp
# Opt level: O2

void __thiscall
ProtocolMACEthernet::Transmit
          (ProtocolMACEthernet *this,DataBuffer *buffer,uint8_t *targetMAC,uint16_t type)

{
  uint8_t *puVar1;
  size_t sVar2;
  ulong uVar3;
  
  puVar1 = buffer->Packet;
  buffer->Packet = puVar1 + -0xe;
  buffer->Length = buffer->Length + 0xe;
  sVar2 = PackBytes(puVar1 + -0xe,0,targetMAC,6);
  sVar2 = PackBytes(buffer->Packet,sVar2,this->UnicastAddress,6);
  Pack16(buffer->Packet,sVar2,type);
  while( true ) {
    uVar3 = (ulong)buffer->Length;
    if (0x3b < uVar3) break;
    buffer->Length = buffer->Length + 1;
    buffer->Packet[uVar3] = '\0';
  }
  if (this->TxHandler != (DataTransmitHandler)0x0) {
    (*this->TxHandler)(buffer->Packet,uVar3);
  }
  if (buffer->Disposable == true) {
    osQueue::Put(&this->TxBufferQueue,buffer);
    return;
  }
  return;
}

Assistant:

void ProtocolMACEthernet::Transmit(DataBuffer* buffer, const uint8_t* targetMAC, uint16_t type)
{
    buffer->Packet -= header_size();
    buffer->Length += header_size();

    size_t offset = 0;
    offset = PackBytes(buffer->Packet, offset, targetMAC, 6);
    offset = PackBytes(buffer->Packet, offset, UnicastAddress, 6);
    offset = Pack16(buffer->Packet, offset, type);

    offset += buffer->Length;
    while (buffer->Length < 60)
    {
        buffer->Packet[buffer->Length++] = 0;
    }

    if (TxHandler)
    {
        TxHandler(buffer->Packet, buffer->Length);
    }

    if (buffer->Disposable)
    {
        TxBufferQueue.Put(buffer);
    }
}